

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPHashAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPHashAlgorithm::hashFinal(OSSLEVPHashAlgorithm *this,ByteString *hashedData)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *md;
  ByteString *in_RSI;
  HashAlgorithm *in_RDI;
  uint outLen;
  ByteString *in_stack_ffffffffffffffd0;
  EVP_MD_CTX *ctx;
  uint local_1c;
  ByteString *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = HashAlgorithm::hashFinal(in_RDI,in_RSI);
  if (bVar1) {
    iVar2 = (*in_RDI->_vptr_HashAlgorithm[6])();
    EVP_MD_get_size(iVar2);
    ByteString::resize(in_stack_ffffffffffffffd0,(size_t)local_18);
    sVar3 = ByteString::size((ByteString *)0x131d12);
    local_1c = (uint)sVar3;
    ctx = (EVP_MD_CTX *)in_RDI[1]._vptr_HashAlgorithm;
    md = ByteString::operator[]((ByteString *)ctx,(size_t)local_18);
    iVar2 = EVP_DigestFinal_ex(ctx,md,&local_1c);
    if (iVar2 == 0) {
      softHSMLog(3,"hashFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPHashAlgorithm.cpp"
                 ,0x76,"EVP_DigestFinal failed");
      EVP_MD_CTX_free(in_RDI[1]._vptr_HashAlgorithm);
      in_RDI[1]._vptr_HashAlgorithm = (_func_int **)0x0;
      local_1 = false;
    }
    else {
      ByteString::resize((ByteString *)ctx,(size_t)local_18);
      EVP_MD_CTX_free(in_RDI[1]._vptr_HashAlgorithm);
      in_RDI[1]._vptr_HashAlgorithm = (_func_int **)0x0;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OSSLEVPHashAlgorithm::hashFinal(ByteString& hashedData)
{
	if (!HashAlgorithm::hashFinal(hashedData))
	{
		return false;
	}

	hashedData.resize(EVP_MD_size(getEVPHash()));
	unsigned int outLen = hashedData.size();

	if (!EVP_DigestFinal_ex(curCTX, &hashedData[0], &outLen))
	{
		ERROR_MSG("EVP_DigestFinal failed");

		EVP_MD_CTX_free(curCTX);
		curCTX = NULL;

		return false;
	}

	hashedData.resize(outLen);

	EVP_MD_CTX_free(curCTX);
	curCTX = NULL;

	return true;
}